

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O2

int ASN1_STRING_TABLE_add(int param_1,long param_2,long param_3,ulong param_4,ulong param_5)

{
  int iVar1;
  ASN1_STRING_TABLE *pAVar2;
  ASN1_STRING_TABLE *old_tbl;
  ASN1_STRING_TABLE key;
  
  pAVar2 = asn1_string_table_get(param_1);
  if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
    ERR_put_error(0xc,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                  ,0x99);
    return 0;
  }
  CRYPTO_MUTEX_lock_write(&string_tables_lock);
  if (string_tables == (lhash_st_ASN1_STRING_TABLE *)0x0) {
    string_tables = (lhash_st_ASN1_STRING_TABLE *)OPENSSL_lh_new(table_hash,table_cmp);
    if ((_LHASH *)string_tables == (_LHASH *)0x0) {
      iVar1 = 0;
      goto LAB_003ca665;
    }
  }
  else {
    key.nid = param_1;
    pAVar2 = lh_ASN1_STRING_TABLE_retrieve(string_tables,&key);
    if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
      ERR_put_error(0xc,0,0x42,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                    ,0xac);
      iVar1 = 0;
      goto LAB_003ca665;
    }
  }
  pAVar2 = (ASN1_STRING_TABLE *)OPENSSL_malloc(0x28);
  iVar1 = 0;
  if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
    pAVar2->nid = param_1;
    pAVar2->flags = param_5;
    pAVar2->minsize = param_2;
    pAVar2->maxsize = param_3;
    pAVar2->mask = param_4;
    iVar1 = lh_ASN1_STRING_TABLE_insert(string_tables,&old_tbl,pAVar2);
    if (iVar1 == 0) {
      OPENSSL_free(pAVar2);
      iVar1 = 0;
    }
    else {
      if (old_tbl != (ASN1_STRING_TABLE *)0x0) {
        __assert_fail("old_tbl == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                      ,0xc0,
                      "int ASN1_STRING_TABLE_add(int, long, long, unsigned long, unsigned long)");
      }
      iVar1 = 1;
    }
  }
LAB_003ca665:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return iVar1;
}

Assistant:

int ASN1_STRING_TABLE_add(int nid, long minsize, long maxsize,
                          unsigned long mask, unsigned long flags) {
  // Existing entries cannot be overwritten.
  if (asn1_string_table_get(nid) != NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  int ret = 0;
  CRYPTO_MUTEX_lock_write(&string_tables_lock);

  ASN1_STRING_TABLE *tbl = NULL;
  if (string_tables == NULL) {
    string_tables = lh_ASN1_STRING_TABLE_new(table_hash, table_cmp);
    if (string_tables == NULL) {
      goto err;
    }
  } else {
    // Check again for an existing entry. One may have been added while
    // unlocked.
    ASN1_STRING_TABLE key;
    key.nid = nid;
    if (lh_ASN1_STRING_TABLE_retrieve(string_tables, &key) != NULL) {
      OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      goto err;
    }
  }

  tbl = reinterpret_cast<ASN1_STRING_TABLE *>(
      OPENSSL_malloc(sizeof(ASN1_STRING_TABLE)));
  if (tbl == NULL) {
    goto err;
  }
  tbl->nid = nid;
  tbl->flags = flags;
  tbl->minsize = minsize;
  tbl->maxsize = maxsize;
  tbl->mask = mask;
  ASN1_STRING_TABLE *old_tbl;
  if (!lh_ASN1_STRING_TABLE_insert(string_tables, &old_tbl, tbl)) {
    OPENSSL_free(tbl);
    goto err;
  }
  assert(old_tbl == NULL);
  ret = 1;

err:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return ret;
}